

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TableGetColumnIsSorted(int column_n)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 != (ImGuiTable *)0x0) {
    if (column_n < 0) {
      column_n = pIVar1->CurrentColumn;
    }
    pIVar2 = (pIVar1->Columns).Data + column_n;
    if ((pIVar1->Columns).DataEnd <= pIVar2) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                  ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
    }
    return pIVar2->SortOrder != -1;
  }
  return false;
}

Assistant:

bool ImGui::TableGetColumnIsSorted(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];
    return (column->SortOrder != -1);
}